

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool __thiscall ImGuiListClipper::Step(ImGuiListClipper *this)

{
  ImGuiWindow *pIVar1;
  ImGuiListClipper *in_RDI;
  float fVar2;
  float items_height;
  float in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  if ((in_RDI->ItemsCount == 0) ||
     (pIVar1 = ImGui::GetCurrentWindowRead(), (pIVar1->SkipItems & 1U) != 0)) {
    in_RDI->ItemsCount = -1;
    return false;
  }
  if (in_RDI->StepNo == 0) {
    in_RDI->DisplayStart = 0;
    in_RDI->DisplayEnd = 1;
    fVar2 = ImGui::GetCursorPosY();
    in_RDI->StartPosY = fVar2;
    in_RDI->StepNo = 1;
    return true;
  }
  if (in_RDI->StepNo == 1) {
    if (in_RDI->ItemsCount == 1) {
      in_RDI->ItemsCount = -1;
      return false;
    }
    ImGui::GetCursorPosY();
    Begin(in_RDI,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
    in_RDI->DisplayStart = in_RDI->DisplayStart + 1;
    in_RDI->DisplayEnd = in_RDI->DisplayEnd + 1;
    in_RDI->StepNo = 3;
    return true;
  }
  if (in_RDI->StepNo == 2) {
    in_RDI->StepNo = 3;
    return true;
  }
  if (in_RDI->StepNo == 3) {
    End(in_RDI);
  }
  return false;
}

Assistant:

bool ImGuiListClipper::Step()
{
    if (ItemsCount == 0 || ImGui::GetCurrentWindowRead()->SkipItems)
    {
        ItemsCount = -1;
        return false;
    }
    if (StepNo == 0) // Step 0: the clipper let you process the first element, regardless of it being visible or not, so we can measure the element height.
    {
        DisplayStart = 0;
        DisplayEnd = 1;
        StartPosY = ImGui::GetCursorPosY();
        StepNo = 1;
        return true;
    }
    if (StepNo == 1) // Step 1: the clipper infer height from first element, calculate the actual range of elements to display, and position the cursor before the first element.
    {
        if (ItemsCount == 1) { ItemsCount = -1; return false; }
        float items_height = ImGui::GetCursorPosY() - StartPosY;
        IM_ASSERT(items_height > 0.0f);   // If this triggers, it means Item 0 hasn't moved the cursor vertically
        Begin(ItemsCount-1, items_height);
        DisplayStart++;
        DisplayEnd++;
        StepNo = 3;
        return true;
    }
    if (StepNo == 2) // Step 2: dummy step only required if an explicit items_height was passed to constructor or Begin() and user still call Step(). Does nothing and switch to Step 3.
    {
        IM_ASSERT(DisplayStart >= 0 && DisplayEnd >= 0);
        StepNo = 3;
        return true;
    }
    if (StepNo == 3) // Step 3: the clipper validate that we have reached the expected Y position (corresponding to element DisplayEnd), advance the cursor to the end of the list and then returns 'false' to end the loop.
        End();
    return false;
}